

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerFlow.cpp
# Opt level: O1

void __thiscall WorkerFlow::~WorkerFlow(WorkerFlow *this)

{
  zmq_close(this->m_stream_socket);
  zmq_close(this->m_notif_socket);
  zmq_ctx_term(this->m_context);
  if (this->m_buffer != (char *)0x0) {
    operator_delete__(this->m_buffer);
  }
  if ((this->m_callback_owned == true) && (this->m_cb != (Callback *)0x0)) {
    operator_delete(this->m_cb,8);
    return;
  }
  return;
}

Assistant:

WorkerFlow::~WorkerFlow()
{
    // safely close ZMQ entities.
    zmq_close(m_stream_socket);
    zmq_close(m_notif_socket);
    zmq_ctx_term(m_context);
    delete[] m_buffer;
    // If I own the callback,
    // I have to take care of it
    if (m_callback_owned) {
        delete m_cb;
    }
}